

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O0

void inssort_cache(cacheblock_t *cache,int n,size_t depth)

{
  uchar *puVar1;
  bool bVar2;
  uchar *tmp;
  uchar *t;
  uchar *s;
  cacheblock_t *pj;
  cacheblock_t *pi;
  size_t depth_local;
  int n_local;
  cacheblock_t *cache_local;
  
  pj = cache + 1;
  depth_local._4_4_ = n;
  do {
    depth_local._4_4_ = depth_local._4_4_ + -1;
    if (depth_local._4_4_ < 1) {
      return;
    }
    puVar1 = pj->ptr;
    for (s = pj->bytes; cache < s; s = s + -0x10) {
      tmp = puVar1 + depth;
      t = (uchar *)(*(long *)(s + -8) + depth);
      while( true ) {
        bVar2 = false;
        if (*t == *tmp) {
          bVar2 = *t != '\0';
        }
        if (!bVar2) break;
        t = t + 1;
        tmp = tmp + 1;
      }
      if (*t <= *tmp) break;
      *(undefined8 *)(s + 8) = *(undefined8 *)(s + -8);
    }
    *(uchar **)(s + 8) = puVar1;
    pj = pj + 1;
  } while( true );
}

Assistant:

static inline void
inssort_cache(cacheblock_t* cache, int n, size_t depth)
{
	cacheblock_t *pi, *pj;
	unsigned char *s, *t;
	for (pi = cache + 1; --n > 0; ++pi) {
		unsigned char* tmp = pi->ptr;
		for (pj = pi; pj > cache; --pj) {
			t = tmp + depth;
			for (s=(pj-1)->ptr+depth; *s==*t && *s!=0; ++s, ++t)
				;
			if (*s <= *t)
				break;
			pj->ptr = (pj-1)->ptr;
		}
		pj->ptr = tmp;
	}
}